

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

wl_buffer * createShmBuffer(GLFWimage *image)

{
  byte bVar1;
  uchar *puVar2;
  wl_shm *pwVar3;
  PFN_wl_proxy_marshal_flags p_Var4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  size_t sVar9;
  char *__dest;
  int *piVar10;
  void *__addr;
  wl_proxy *pwVar11;
  wl_proxy *pwVar12;
  char *pcVar13;
  long lVar14;
  size_t __len;
  ulong uVar15;
  uint uVar16;
  
  uVar5 = image->width * 4;
  uVar16 = image->height * uVar5;
  __len = (size_t)(int)uVar16;
  uVar6 = memfd_create("glfw-shared",3);
  if ((int)uVar6 < 0) {
    pcVar13 = getenv("XDG_RUNTIME_DIR");
    if (pcVar13 == (char *)0x0) {
      iVar7 = 2;
      goto LAB_001275c4;
    }
    sVar9 = strlen(pcVar13);
    __dest = (char *)_glfw_calloc(sVar9 + 0x14,1);
    strcpy(__dest,pcVar13);
    sVar9 = strlen(__dest);
    builtin_strncpy(__dest + sVar9,"/glfw-shared-XXXXXX",0x14);
    uVar6 = mkostemp(__dest,0x80000);
    if (-1 < (int)uVar6) {
      unlink(__dest);
    }
    _glfw_free(__dest);
    if (-1 < (int)uVar6) goto LAB_00127517;
  }
  else {
    fcntl(uVar6,0x409,3);
LAB_00127517:
    uVar15 = (ulong)uVar6;
    iVar7 = posix_fallocate(uVar6,0,__len);
    if (iVar7 == 0) goto LAB_001275d1;
    close(uVar6);
LAB_001275c4:
    piVar10 = __errno_location();
    *piVar10 = iVar7;
  }
  uVar15 = 0xffffffff;
LAB_001275d1:
  iVar7 = (int)uVar15;
  if (iVar7 < 0) {
    piVar10 = __errno_location();
    pcVar13 = strerror(*piVar10);
    _glfwInputError(0x10008,"Wayland: Failed to create buffer file of size %d: %s",(ulong)uVar16,
                    pcVar13);
  }
  else {
    __addr = mmap((void *)0x0,__len,3,1,iVar7,0);
    p_Var4 = _glfw.wl.client.proxy_marshal_flags;
    pwVar3 = _glfw.wl.shm;
    if (__addr != (void *)0xffffffffffffffff) {
      uVar8 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.shm);
      pwVar11 = (*p_Var4)((wl_proxy *)pwVar3,0,&_glfw_wl_shm_pool_interface,uVar8,0,0,uVar15,
                          (ulong)uVar16);
      close(iVar7);
      uVar6 = image->width;
      uVar16 = image->height;
      if (0 < (int)(uVar16 * uVar6)) {
        puVar2 = image->pixels;
        lVar14 = 0;
        do {
          bVar1 = puVar2[lVar14 * 4 + 3];
          *(char *)((long)__addr + lVar14 * 4) =
               (char)((ulong)((uint)puVar2[lVar14 * 4 + 2] * (uint)bVar1) * 0x1010102 >> 0x20);
          *(char *)((long)__addr + lVar14 * 4 + 1) =
               (char)((ulong)((uint)puVar2[lVar14 * 4 + 1] * (uint)bVar1) * 0x1010102 >> 0x20);
          *(char *)((long)__addr + lVar14 * 4 + 2) =
               (char)((ulong)((uint)puVar2[lVar14 * 4] * (uint)bVar1) * 0x1010102 >> 0x20);
          *(byte *)((long)__addr + lVar14 * 4 + 3) = bVar1;
          uVar6 = image->width;
          uVar16 = image->height;
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 < (int)(uVar16 * uVar6));
      }
      p_Var4 = _glfw.wl.client.proxy_marshal_flags;
      uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
      pwVar12 = (*p_Var4)(pwVar11,0,&_glfw_wl_buffer_interface,uVar8,0,0,0,(ulong)uVar6,
                          (ulong)uVar16,(ulong)uVar5,0);
      munmap(__addr,__len);
      p_Var4 = _glfw.wl.client.proxy_marshal_flags;
      uVar8 = (*_glfw.wl.client.proxy_get_version)(pwVar11);
      (*p_Var4)(pwVar11,1,(wl_interface *)0x0,uVar8,1);
      return (wl_buffer *)pwVar12;
    }
    piVar10 = __errno_location();
    pcVar13 = strerror(*piVar10);
    _glfwInputError(0x10008,"Wayland: Failed to map file: %s",pcVar13);
    close(iVar7);
  }
  return (wl_buffer *)0x0;
}

Assistant:

static struct wl_buffer* createShmBuffer(const GLFWimage* image)
{
    const int stride = image->width * 4;
    const int length = image->width * image->height * 4;

    const int fd = createAnonymousFile(length);
    if (fd < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to create buffer file of size %d: %s",
                        length, strerror(errno));
        return NULL;
    }

    void* data = mmap(NULL, length, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if (data == MAP_FAILED)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Wayland: Failed to map file: %s", strerror(errno));
        close(fd);
        return NULL;
    }

    struct wl_shm_pool* pool = wl_shm_create_pool(_glfw.wl.shm, fd, length);

    close(fd);

    unsigned char* source = (unsigned char*) image->pixels;
    unsigned char* target = data;
    for (int i = 0;  i < image->width * image->height;  i++, source += 4)
    {
        unsigned int alpha = source[3];

        *target++ = (unsigned char) ((source[2] * alpha) / 255);
        *target++ = (unsigned char) ((source[1] * alpha) / 255);
        *target++ = (unsigned char) ((source[0] * alpha) / 255);
        *target++ = (unsigned char) alpha;
    }

    struct wl_buffer* buffer =
        wl_shm_pool_create_buffer(pool, 0,
                                  image->width,
                                  image->height,
                                  stride, WL_SHM_FORMAT_ARGB8888);
    munmap(data, length);
    wl_shm_pool_destroy(pool);

    return buffer;
}